

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Node<int,_QByteArray> * __thiscall
QHashPrivate::Span<QHashPrivate::Node<int,_QByteArray>_>::insert
          (Span<QHashPrivate::Node<int,_QByteArray>_> *this,size_t i)

{
  Span<QHashPrivate::Node<int,_QByteArray>_> SVar1;
  long lVar2;
  
  if (this[0x89] == this[0x88]) {
    addStorage(this);
  }
  SVar1 = this[0x89];
  lVar2 = (ulong)(byte)SVar1 * 0x20;
  this[0x89] = *(Span<QHashPrivate::Node<int,_QByteArray>_> *)(*(long *)(this + 0x80) + lVar2);
  this[i] = SVar1;
  return (Node<int,_QByteArray> *)(lVar2 + *(long *)(this + 0x80));
}

Assistant:

Node *insert(size_t i)
    {
        Q_ASSERT(i < SpanConstants::NEntries);
        Q_ASSERT(offsets[i] == SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        unsigned char entry = nextFree;
        Q_ASSERT(entry < allocated);
        nextFree = entries[entry].nextFree();
        offsets[i] = entry;
        return &entries[entry].node();
    }